

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* str_fields(string *s,string *delim)

{
  long lVar1;
  ulong in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t e;
  size_t b;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  string local_50 [32];
  long local_30;
  long local_28;
  undefined1 local_19;
  ulong local_18;
  string *local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x200d56);
  local_28 = 0;
  local_30 = std::__cxx11::string::find(local_10,local_18);
  while (local_30 != -1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(in_stack_ffffffffffffff80,in_RDI);
    std::__cxx11::string::~string(local_50);
    lVar1 = local_30;
    local_28 = std::__cxx11::string::length();
    local_28 = lVar1 + local_28;
    local_30 = std::__cxx11::string::find(local_10,local_18);
  }
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffff80,(ulong)local_10);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(in_stack_ffffffffffffff80,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> str_fields (const std::string& s,
                                     const std::string& delim)
{
    std::vector<std::string> v;
 
    // find all tokens before the last
    size_t b = 0;                                   // begin
    for (size_t e = s.find(delim);                  // end
         e != std::string::npos;
         b = e + delim.length(), e = s.find(delim, b))
    {
        v.emplace_back(s.substr(b, e-b));
    }
    
    // add the last one: the remainder of the string (could be empty!)
    v.emplace_back(s.substr(b));
    
    return v;
}